

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.cpp
# Opt level: O2

void __thiscall
duckdb::Prefix::Prefix
          (Prefix *this,unsafe_unique_ptr<FixedSizeAllocator> *allocator,Node ptr_p,idx_t count)

{
  data_ptr_t pdVar1;
  
  pdVar1 = FixedSizeAllocator::Get
                     ((allocator->
                      super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                      )._M_t.
                      super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
                      .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl,
                      ptr_p.super_IndexPointer.data,true);
  this->data = pdVar1;
  this->ptr = (Node *)(pdVar1 + count + 1);
  this->in_memory = true;
  return;
}

Assistant:

Prefix::Prefix(unsafe_unique_ptr<FixedSizeAllocator> &allocator, const Node ptr_p, const idx_t count) {
	data = allocator->Get(ptr_p, true);
	ptr = reinterpret_cast<Node *>(data + count + 1);
	in_memory = true;
}